

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue_examples.cpp
# Opt level: O0

void density_tests::heterogeneous_queue_consume_operation_samples(void)

{
  ControlBlock **this;
  bool bVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *phVar4;
  runtime_type<> *prVar5;
  void *pvVar6;
  difference_type dVar7;
  int *piVar8;
  ControlBlock *i_address;
  ControlBlock *pCVar9;
  ostream *poVar10;
  byte local_459;
  byte local_441;
  undefined1 local_3e8 [8];
  consume_operation consume_15;
  undefined1 local_3d0 [8];
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_15;
  int *element_ptr;
  void *unaligned_ptr;
  undefined1 local_3a8 [7];
  bool is_overaligned;
  consume_operation consume_14;
  undefined1 local_390 [8];
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_14;
  const_iterator local_360;
  runtime_type<> local_340;
  undefined1 local_338 [8];
  consume_operation consume_2;
  consume_operation consume_1_2;
  undefined1 local_310 [8];
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_13;
  consume_operation consume_13;
  undefined1 local_2e8 [8];
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_12;
  const_iterator local_2b8;
  runtime_type<> local_298;
  undefined1 local_290 [8];
  consume_operation consume_12;
  undefined1 local_278 [8];
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_11;
  const_iterator local_248;
  undefined1 local_228 [8];
  consume_operation consume_11;
  undefined1 local_210 [8];
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_10;
  consume_operation consume_10;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_9;
  undefined1 local_1d0 [8];
  consume_operation consume_9;
  undefined1 local_1b8 [8];
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_8;
  undefined1 local_198 [8];
  consume_operation consume_8;
  undefined1 local_180 [8];
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_7;
  undefined1 local_160 [8];
  consume_operation consume_7;
  undefined1 local_148 [8];
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_6;
  int local_124;
  undefined1 local_120 [8];
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_5;
  consume_operation consume_1_1;
  consume_operation consume_6;
  undefined1 local_e8 [8];
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_4;
  type consume_1;
  consume_operation consume_5;
  undefined1 local_b0 [8];
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_3;
  consume_operation consume_4;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_2;
  consume_operation consume_3;
  int local_64;
  undefined1 local_60 [8];
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_1;
  undefined1 local_48 [8];
  consume_operation consume;
  int local_1c;
  undefined1 local_18 [8];
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue;
  
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              local_18);
  local_1c = 0x2a;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  push<int>((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
            local_18,&local_1c);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  emplace<std::__cxx11::string,char_const(&)[13]>
            ((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
             local_18,(char (*) [13])"Hello world!");
  consume.m_control = (ControlBlock *)0x4045000000000000;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  push<double>((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               local_18,(double *)&consume.m_control);
  do {
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    try_start_consume((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                       *)local_48);
    bVar1 = density::heter_queue::consume_operation::operator_cast_to_bool
                      ((consume_operation *)local_48);
    if (bVar1) {
      prVar5 = density::
               heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
               consume_operation::complete_type((consume_operation *)local_48);
      bVar1 = density::runtime_type<>::is<int>(prVar5);
      if (bVar1) {
        poVar10 = std::operator<<((ostream *)&std::cout,"Found an int: ");
        piVar8 = density::
                 heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                 consume_operation::element<int>((consume_operation *)local_48);
        pvVar6 = (void *)std::ostream::operator<<(poVar10,*piVar8);
        std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
      }
      else {
        prVar5 = density::
                 heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                 consume_operation::complete_type((consume_operation *)local_48);
        bVar1 = density::runtime_type<>::is<std::__cxx11::string>(prVar5);
        if (bVar1) {
          poVar10 = std::operator<<((ostream *)&std::cout,"Found a string: ");
          pbVar3 = density::
                   heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
                   consume_operation::element<std::__cxx11::string>((consume_operation *)local_48);
          poVar10 = std::operator<<(poVar10,(string *)pbVar3);
          std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        }
      }
      density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      consume_operation::commit((consume_operation *)local_48);
      queue_1.m_tail._4_4_ = 0;
    }
    else {
      queue_1.m_tail._4_4_ = 3;
    }
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    consume_operation::~consume_operation((consume_operation *)local_48);
  } while (queue_1.m_tail._4_4_ == 0);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               local_18);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              local_60);
  local_64 = 0x2a;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  push<int>((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
            local_60,&local_64);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  emplace<std::__cxx11::string,char_const(&)[13]>
            ((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
             local_60,(char (*) [13])"Hello world!");
  consume_3.m_control = (ControlBlock *)0x4045000000000000;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  push<double>((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               local_60,(double *)&consume_3.m_control);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::consume_operation((consume_operation *)&queue_2.m_tail);
  while (bVar1 = density::
                 heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                 try_start_consume((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                                    *)local_60,(consume_operation *)&queue_2.m_tail), bVar1) {
    prVar5 = density::
             heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
             consume_operation::complete_type((consume_operation *)&queue_2.m_tail);
    bVar1 = density::runtime_type<>::is<int>(prVar5);
    if (bVar1) {
      poVar10 = std::operator<<((ostream *)&std::cout,"Found an int: ");
      piVar8 = density::
               heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
               consume_operation::element<int>((consume_operation *)&queue_2.m_tail);
      pvVar6 = (void *)std::ostream::operator<<(poVar10,*piVar8);
      std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    }
    else {
      prVar5 = density::
               heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
               consume_operation::complete_type((consume_operation *)&queue_2.m_tail);
      bVar1 = density::runtime_type<>::is<std::__cxx11::string>(prVar5);
      if (bVar1) {
        poVar10 = std::operator<<((ostream *)&std::cout,"Found a string: ");
        pbVar3 = density::
                 heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
                 consume_operation::element<std::__cxx11::string>
                           ((consume_operation *)&queue_2.m_tail);
        poVar10 = std::operator<<(poVar10,(string *)pbVar3);
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      }
    }
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    consume_operation::commit((consume_operation *)&queue_2.m_tail);
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::~consume_operation((consume_operation *)&queue_2.m_tail);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               local_60);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              &consume_4.m_control);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::consume_operation((consume_operation *)&queue_3.m_tail);
  bVar1 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::consume_operation::empty((consume_operation *)&queue_3.m_tail);
  if (!bVar1) {
    __assert_fail("consume.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x1e0,"void density_tests::heterogeneous_queue_consume_operation_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::~consume_operation((consume_operation *)&queue_3.m_tail);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               &consume_4.m_control);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              local_b0);
  consume_5.m_control._4_4_ = 0x2a;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  push<int>((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
            local_b0,(int *)((long)&consume_5.m_control + 4));
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  try_start_consume((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)&consume_1.m_control);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::consume_operation
            ((consume_operation *)&queue_4.m_tail,(consume_operation *)&consume_1.m_control);
  bVar1 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::consume_operation::empty((consume_operation *)&consume_1.m_control);
  local_441 = 0;
  if (bVar1) {
    bVar1 = density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            consume_operation::empty((consume_operation *)&queue_4.m_tail);
    local_441 = bVar1 ^ 0xff;
  }
  if ((local_441 & 1) == 0) {
    __assert_fail("consume.empty() && !consume_1.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,500,"void density_tests::heterogeneous_queue_consume_operation_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::commit((consume_operation *)&queue_4.m_tail);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::~consume_operation((consume_operation *)&queue_4.m_tail);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::~consume_operation((consume_operation *)&consume_1.m_control);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               local_b0);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              local_e8);
  consume_6.m_control._4_4_ = 0x2a;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  push<int>((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
            local_e8,(int *)((long)&consume_6.m_control + 4));
  consume_6.m_control._0_4_ = 0x2b;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  push<int>((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
            local_e8,(int *)&consume_6.m_control);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  try_start_consume((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)&consume_1_1.m_control);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::consume_operation((consume_operation *)&queue_5.m_tail);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::operator=
            ((consume_operation *)&queue_5.m_tail,(consume_operation *)&consume_1_1.m_control);
  bVar1 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::consume_operation::empty((consume_operation *)&consume_1_1.m_control);
  local_459 = 0;
  if (bVar1) {
    bVar1 = density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            consume_operation::empty((consume_operation *)&queue_5.m_tail);
    local_459 = bVar1 ^ 0xff;
  }
  if ((local_459 & 1) == 0) {
    __assert_fail("consume.empty() && !consume_1.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x202,"void density_tests::heterogeneous_queue_consume_operation_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::commit((consume_operation *)&queue_5.m_tail);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::~consume_operation((consume_operation *)&queue_5.m_tail);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::~consume_operation((consume_operation *)&consume_1_1.m_control);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               local_e8);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              local_120);
  local_124 = 0x2a;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  push<int>((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
            local_120,&local_124);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  try_start_consume((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)&queue_6.m_tail);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::~consume_operation((consume_operation *)&queue_6.m_tail);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               local_120);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              local_148);
  consume_7.m_control._4_4_ = 0x2a;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  push<int>((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
            local_148,(int *)((long)&consume_7.m_control + 4));
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::consume_operation((consume_operation *)local_160);
  bVar1 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::consume_operation::empty((consume_operation *)local_160);
  if (!bVar1) {
    __assert_fail("consume.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x215,"void density_tests::heterogeneous_queue_consume_operation_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  try_start_consume((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)&queue_7.m_tail);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::operator=((consume_operation *)local_160,(consume_operation *)&queue_7.m_tail);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::~consume_operation((consume_operation *)&queue_7.m_tail);
  bVar1 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::consume_operation::empty((consume_operation *)local_160);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!consume.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x217,"void density_tests::heterogeneous_queue_consume_operation_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::~consume_operation((consume_operation *)local_160);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               local_148);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              local_180);
  consume_8.m_control._4_4_ = 0x2a;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  push<int>((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
            local_180,(int *)((long)&consume_8.m_control + 4));
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::consume_operation((consume_operation *)local_198);
  bVar1 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::consume_operation::empty((consume_operation *)local_198);
  bVar2 = density::heter_queue::consume_operation::operator_cast_to_bool
                    ((consume_operation *)local_198);
  if (bVar1 != (bool)((bVar2 ^ 0xffU) & 1)) {
    __assert_fail("consume.empty() == !consume",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x220,"void density_tests::heterogeneous_queue_consume_operation_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  try_start_consume((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)&queue_8.m_tail);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::operator=((consume_operation *)local_198,(consume_operation *)&queue_8.m_tail);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::~consume_operation((consume_operation *)&queue_8.m_tail);
  bVar1 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::consume_operation::empty((consume_operation *)local_198);
  bVar2 = density::heter_queue::consume_operation::operator_cast_to_bool
                    ((consume_operation *)local_198);
  if (bVar1 != (bool)((bVar2 ^ 0xffU) & 1)) {
    __assert_fail("consume.empty() == !consume",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x222,"void density_tests::heterogeneous_queue_consume_operation_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::~consume_operation((consume_operation *)local_198);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               local_180);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              local_1b8);
  consume_9.m_control._4_4_ = 0x2a;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  push<int>((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
            local_1b8,(int *)((long)&consume_9.m_control + 4));
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::consume_operation((consume_operation *)local_1d0);
  bVar2 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::consume_operation::empty((consume_operation *)local_1d0);
  bVar1 = false;
  if (bVar2) {
    bVar2 = density::heter_queue::consume_operation::operator_cast_to_bool
                      ((consume_operation *)local_1d0);
    bVar1 = false;
    if (!bVar2) {
      phVar4 = density::
               heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
               consume_operation::queue((consume_operation *)local_1d0);
      bVar1 = phVar4 == (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                         *)0x0;
    }
  }
  if (!bVar1) {
    __assert_fail("consume.empty() && !consume && consume.queue() == nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x22b,"void density_tests::heterogeneous_queue_consume_operation_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  try_start_consume((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)&queue_9.m_tail);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::operator=((consume_operation *)local_1d0,(consume_operation *)&queue_9.m_tail);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::~consume_operation((consume_operation *)&queue_9.m_tail);
  bVar2 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::consume_operation::empty((consume_operation *)local_1d0);
  bVar1 = false;
  if (!bVar2) {
    bVar2 = density::heter_queue::consume_operation::operator_cast_to_bool
                      ((consume_operation *)local_1d0);
    bVar1 = false;
    if (bVar2) {
      phVar4 = density::
               heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
               consume_operation::queue((consume_operation *)local_1d0);
      bVar1 = phVar4 == (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                         *)local_1b8;
    }
  }
  if (!bVar1) {
    __assert_fail("!consume.empty() && !!consume && consume.queue() == &queue",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x22d,"void density_tests::heterogeneous_queue_consume_operation_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::~consume_operation((consume_operation *)local_1d0);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               local_1b8);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              &consume_10.m_control);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  emplace<std::__cxx11::string,char_const(&)[4]>
            ((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
             &consume_10.m_control,(char (*) [4])"abc");
  this = &queue_10.m_tail;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  try_start_consume((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)this);
  prVar5 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
           ::consume_operation::complete_type((consume_operation *)this);
  pvVar6 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
           ::consume_operation::element_ptr((consume_operation *)this);
  density::runtime_type<>::destroy(prVar5,pvVar6);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::commit_nodestroy((consume_operation *)this);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::~consume_operation((consume_operation *)this);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               &consume_10.m_control);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              local_210);
  consume_11.m_control._4_4_ = 0x2a;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  push<int>((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
            local_210,(int *)((long)&consume_11.m_control + 4));
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  try_start_consume((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)local_228);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::cancel((consume_operation *)local_228);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::cbegin
            (&local_248,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             local_210);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::cend
            ((const_iterator *)&queue_11.m_tail,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             local_210);
  dVar7 = std::
          distance<density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::const_iterator>
                    (&local_248,(const_iterator *)&queue_11.m_tail);
  if (dVar7 != 1) {
    __assert_fail("std::distance(queue.cbegin(), queue.cend()) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x245,"void density_tests::heterogeneous_queue_consume_operation_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  const_iterator::~const_iterator((const_iterator *)&queue_11.m_tail);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  const_iterator::~const_iterator(&local_248);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::~consume_operation((consume_operation *)local_228);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               local_210);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              local_278);
  consume_12.m_control._4_4_ = 0x2a;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  push<int>((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
            local_278,(int *)((long)&consume_12.m_control + 4));
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  try_start_consume((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)local_290);
  prVar5 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
           ::consume_operation::complete_type((consume_operation *)local_290);
  bVar1 = density::runtime_type<>::is<int>(prVar5);
  if (!bVar1) {
    __assert_fail("consume.complete_type().is<int>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x24e,"void density_tests::heterogeneous_queue_consume_operation_samples()");
  }
  prVar5 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
           ::consume_operation::complete_type((consume_operation *)local_290);
  local_298 = density::runtime_type<>::make<int>();
  bVar1 = density::runtime_type<>::operator==(prVar5,&local_298);
  if (!bVar1) {
    __assert_fail("consume.complete_type() == runtime_type<>::make<int>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x251,"void density_tests::heterogeneous_queue_consume_operation_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::commit((consume_operation *)local_290);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::cbegin
            (&local_2b8,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             local_278);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::cend
            ((const_iterator *)&queue_12.m_tail,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             local_278);
  dVar7 = std::
          distance<density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::const_iterator>
                    (&local_2b8,(const_iterator *)&queue_12.m_tail);
  if (dVar7 != 0) {
    __assert_fail("std::distance(queue.cbegin(), queue.cend()) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x254,"void density_tests::heterogeneous_queue_consume_operation_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  const_iterator::~const_iterator((const_iterator *)&queue_12.m_tail);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  const_iterator::~const_iterator(&local_2b8);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::~consume_operation((consume_operation *)local_290);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               local_278);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              local_2e8);
  consume_13.m_control._4_4_ = 0x2a;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  push<int>((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
            local_2e8,(int *)((long)&consume_13.m_control + 4));
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  try_start_consume((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)&queue_13.m_tail);
  piVar8 = (int *)density::
                  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                  consume_operation::element_ptr((consume_operation *)&queue_13.m_tail);
  *piVar8 = *piVar8 + 1;
  piVar8 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
           ::consume_operation::element<int>((consume_operation *)&queue_13.m_tail);
  if (*piVar8 != 0x2b) {
    __assert_fail("consume.element<int>() == 43",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x25e,"void density_tests::heterogeneous_queue_consume_operation_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::commit((consume_operation *)&queue_13.m_tail);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::~consume_operation((consume_operation *)&queue_13.m_tail);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               local_2e8);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              local_310);
  consume_1_2.m_control._4_4_ = 0x2a;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  push<int>((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
            local_310,(int *)((long)&consume_1_2.m_control + 4));
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  try_start_consume((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)&consume_2.m_control);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::consume_operation((consume_operation *)local_338);
  density::swap((consume_operation *)&consume_2.m_control,(consume_operation *)local_338);
  prVar5 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
           ::consume_operation::complete_type((consume_operation *)local_338);
  bVar1 = density::runtime_type<>::is<int>(prVar5);
  if (!bVar1) {
    __assert_fail("consume_2.complete_type().is<int>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x26d,"void density_tests::heterogeneous_queue_consume_operation_samples()");
  }
  prVar5 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
           ::consume_operation::complete_type((consume_operation *)local_338);
  local_340 = density::runtime_type<>::make<int>();
  bVar1 = density::runtime_type<>::operator==(prVar5,&local_340);
  if (!bVar1) {
    __assert_fail("consume_2.complete_type() == runtime_type<>::make<int>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x270,"void density_tests::heterogeneous_queue_consume_operation_samples()");
  }
  piVar8 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
           ::consume_operation::element<int>((consume_operation *)local_338);
  if (*piVar8 != 0x2a) {
    __assert_fail("consume_2.element<int>() == 42",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x271,"void density_tests::heterogeneous_queue_consume_operation_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::commit((consume_operation *)local_338);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::cbegin
            (&local_360,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             local_310);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::cend
            ((const_iterator *)&queue_14.m_tail,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             local_310);
  dVar7 = std::
          distance<density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::const_iterator>
                    (&local_360,(const_iterator *)&queue_14.m_tail);
  if (dVar7 != 0) {
    __assert_fail("std::distance(queue.cbegin(), queue.cend()) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x274,"void density_tests::heterogeneous_queue_consume_operation_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  const_iterator::~const_iterator((const_iterator *)&queue_14.m_tail);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  const_iterator::~const_iterator(&local_360);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::~consume_operation((consume_operation *)local_338);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::~consume_operation((consume_operation *)&consume_2.m_control);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               local_310);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              local_390);
  consume_14.m_control._4_4_ = 0x2a;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  push<int>((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
            local_390,(int *)((long)&consume_14.m_control + 4));
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  try_start_consume((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)local_3a8);
  i_address = (ControlBlock *)
              density::
              heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
              consume_operation::unaligned_element_ptr((consume_operation *)local_3a8);
  pCVar9 = (ControlBlock *)
           density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
           ::consume_operation::element_ptr((consume_operation *)local_3a8);
  if (i_address != pCVar9) {
    __assert_fail("unaligned_ptr == consume.element_ptr()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x286,"void density_tests::heterogeneous_queue_consume_operation_samples()");
  }
  queue_15.m_tail = i_address;
  bVar1 = density::address_is_aligned(i_address,4);
  if (!bVar1) {
    __assert_fail("address_is_aligned(element_ptr, alignof(int))",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x289,"void density_tests::heterogeneous_queue_consume_operation_samples()");
  }
  poVar10 = std::operator<<((ostream *)&std::cout,"An int: ");
  pvVar6 = (void *)std::ostream::operator<<(poVar10,(int)(queue_15.m_tail)->m_next);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::commit((consume_operation *)local_3a8);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  consume_operation::~consume_operation((consume_operation *)local_3a8);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               local_390);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              local_3d0);
  consume_15.m_control._4_4_ = 0x2a;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  push<int>((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
            local_3d0,(int *)((long)&consume_15.m_control + 4));
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  try_start_consume((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                     *)local_3e8);
  prVar5 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
           ::consume_operation::complete_type((consume_operation *)local_3e8);
  bVar1 = density::runtime_type<>::is<int>(prVar5);
  if (bVar1) {
    poVar10 = std::operator<<((ostream *)&std::cout,"An int: ");
    piVar8 = density::
             heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
             consume_operation::element<int>((consume_operation *)local_3e8);
    pvVar6 = (void *)std::ostream::operator<<(poVar10,*piVar8);
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    consume_operation::commit((consume_operation *)local_3e8);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    consume_operation::~consume_operation((consume_operation *)local_3e8);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
                 )local_3d0);
    return;
  }
  __assert_fail("consume.complete_type().is<int>()",
                "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                ,0x294,"void density_tests::heterogeneous_queue_consume_operation_samples()");
}

Assistant:

void heterogeneous_queue_consume_operation_samples()
    {
        using namespace density;
        {

            //! [heter_queue consume_operation consume_1 example 1]
            heter_queue<> queue;
            queue.push(42);
            queue.emplace<std::string>("Hello world!");
            queue.push(42.);

            while (auto consume = queue.try_start_consume())
            {
                if (consume.complete_type().is<int>())
                    std::cout << "Found an int: " << consume.element<int>() << std::endl;
                else if (consume.complete_type().is<std::string>())
                    std::cout << "Found a string: " << consume.element<std::string>() << std::endl;
                consume.commit();
            }
            //! [heter_queue consume_operation consume_1 example 1]
        }
        {
            //! [heter_queue consume_operation consume_1 example 2]
            heter_queue<> queue;
            queue.push(42);
            queue.emplace<std::string>("Hello world!");
            queue.push(42.);

            heter_queue<>::consume_operation consume;
            while (queue.try_start_consume(consume))
            {
                if (consume.complete_type().is<int>())
                    std::cout << "Found an int: " << consume.element<int>() << std::endl;
                else if (consume.complete_type().is<std::string>())
                    std::cout << "Found a string: " << consume.element<std::string>() << std::endl;
                consume.commit();
            }
            //! [heter_queue consume_operation consume_1 example 2]
        }

        {
            heter_queue<> queue;
            //! [heter_queue consume_operation default_construct example 1]
            heter_queue<>::consume_operation consume;
            assert(consume.empty());
            //! [heter_queue consume_operation default_construct example 1]
        }

        //! [heter_queue consume_operation copy_construct example 1]
        static_assert(!std::is_copy_constructible<heter_queue<>::consume_operation>::value, "");
        //! [heter_queue consume_operation copy_construct example 1]

        //! [heter_queue consume_operation copy_assign example 1]
        static_assert(!std::is_copy_assignable<heter_queue<>::consume_operation>::value, "");
        //! [heter_queue consume_operation copy_assign example 1]

        {
            //! [heter_queue consume_operation move_construct example 1]
            heter_queue<> queue;

            queue.push(42);
            auto consume = queue.try_start_consume();

            auto consume_1 = std::move(consume);
            assert(consume.empty() && !consume_1.empty());
            consume_1.commit();
            //! [heter_queue consume_operation move_construct example 1]
        }
        {
            //! [heter_queue consume_operation move_assign example 1]
            heter_queue<> queue;

            queue.push(42);
            queue.push(43);
            auto consume = queue.try_start_consume();

            heter_queue<>::consume_operation consume_1;
            consume_1 = std::move(consume);
            assert(consume.empty() && !consume_1.empty());
            consume_1.commit();
            //! [heter_queue consume_operation move_assign example 1]
        }
        {
            //! [heter_queue consume_operation destroy example 1]
            heter_queue<> queue;
            queue.push(42);

            // this consumed is started and destroyed before being committed, so it has no observable effects
            queue.try_start_consume();
            //! [heter_queue consume_operation destroy example 1]
        }
        {
            //! [heter_queue consume_operation empty example 1]
            heter_queue<> queue;
            queue.push(42);

            heter_queue<>::consume_operation consume;
            assert(consume.empty());
            consume = queue.try_start_consume();
            assert(!consume.empty());
            //! [heter_queue consume_operation empty example 1]
        }
        {
            //! [heter_queue consume_operation operator_bool example 1]
            heter_queue<> queue;
            queue.push(42);

            heter_queue<>::consume_operation consume;
            assert(consume.empty() == !consume);
            consume = queue.try_start_consume();
            assert(consume.empty() == !consume);
            //! [heter_queue consume_operation operator_bool example 1]
        }
        {
            //! [heter_queue consume_operation queue example 1]
            heter_queue<> queue;
            queue.push(42);

            heter_queue<>::consume_operation consume;
            assert(consume.empty() && !consume && consume.queue() == nullptr);
            consume = queue.try_start_consume();
            assert(!consume.empty() && !!consume && consume.queue() == &queue);
            //! [heter_queue consume_operation queue example 1]
        }
        {
            //! [heter_queue consume_operation commit_nodestroy example 1]
            heter_queue<> queue;
            queue.emplace<std::string>("abc");

            heter_queue<>::consume_operation consume = queue.try_start_consume();
            consume.complete_type().destroy(consume.element_ptr());

            // the string has already been destroyed. Calling commit would trigger an undefined behavior
            consume.commit_nodestroy();
            //! [heter_queue consume_operation commit_nodestroy example 1]
        }
        {
            //! [heter_queue consume_operation cancel example 1]
            heter_queue<> queue;
            queue.push(42);

            heter_queue<>::consume_operation consume = queue.try_start_consume();
            consume.cancel();

            // there is still a 42 in the queue
            assert(std::distance(queue.cbegin(), queue.cend()) == 1);
            //! [heter_queue consume_operation cancel example 1]
        }
        {
            //! [heter_queue consume_operation complete_type example 1]
            heter_queue<> queue;
            queue.push(42);

            heter_queue<>::consume_operation consume = queue.try_start_consume();
            assert(consume.complete_type().is<int>());
            assert(
              consume.complete_type() ==
              runtime_type<>::make<int>()); // same to the previous assert
            consume.commit();

            assert(std::distance(queue.cbegin(), queue.cend()) == 0);
            //! [heter_queue consume_operation complete_type example 1]
        }
        {
            //! [heter_queue consume_operation element_ptr example 1]
            heter_queue<> queue;
            queue.push(42);

            heter_queue<>::consume_operation consume = queue.try_start_consume();
            ++*static_cast<int *>(consume.element_ptr());
            assert(consume.element<int>() == 43);
            consume.commit();
            //! [heter_queue consume_operation element_ptr example 1]
        }
        {
            //! [heter_queue consume_operation swap example 1]
            heter_queue<> queue;
            queue.push(42);

            heter_queue<>::consume_operation consume_1 = queue.try_start_consume();
            heter_queue<>::consume_operation consume_2;
            {
                using namespace std;
                swap(consume_1, consume_2);
            }
            assert(consume_2.complete_type().is<int>());
            assert(
              consume_2.complete_type() ==
              runtime_type<>::make<int>()); // same to the previous assert
            assert(consume_2.element<int>() == 42);
            consume_2.commit();

            assert(std::distance(queue.cbegin(), queue.cend()) == 0);
            //! [heter_queue consume_operation swap example 1]
        }
        {
            //! [heter_queue consume_operation unaligned_element_ptr example 1]
            heter_queue<> queue;
            queue.push(42);

            heter_queue<>::consume_operation consume = queue.try_start_consume();
            bool const   is_overaligned              = alignof(int) > heter_queue<>::min_alignment;
            void * const unaligned_ptr               = consume.unaligned_element_ptr();
            int *        element_ptr;
            if (is_overaligned)
            {
                element_ptr = static_cast<int *>(address_upper_align(unaligned_ptr, alignof(int)));
            }
            else
            {
                assert(unaligned_ptr == consume.element_ptr());
                element_ptr = static_cast<int *>(unaligned_ptr);
            }
            assert(address_is_aligned(element_ptr, alignof(int)));
            std::cout << "An int: " << *element_ptr << std::endl;
            consume.commit();
            //! [heter_queue consume_operation unaligned_element_ptr example 1]
        }
        {
            //! [heter_queue consume_operation element example 1]
            heter_queue<> queue;
            queue.push(42);

            heter_queue<>::consume_operation consume = queue.try_start_consume();
            assert(consume.complete_type().is<int>());
            std::cout << "An int: " << consume.element<int>() << std::endl;
            /* std::cout << "An float: " << consume.element<float>() << std::endl; this would
        trigger an undefined behavior, because the element is not a float */
            consume.commit();
            //! [heter_queue consume_operation element example 1]
        }
    }